

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 141_linkedListCycle.cpp
# Opt level: O3

int main(void)

{
  undefined4 *puVar1;
  ListNode *slow;
  undefined4 *puVar2;
  
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(undefined4 **)(puVar1 + 2) = puVar1;
  puVar2 = puVar1;
  do {
    if ((*(long *)(puVar1 + 2) == 0) ||
       (puVar1 = *(undefined4 **)(*(long *)(puVar1 + 2) + 8), puVar1 == (undefined4 *)0x0)) break;
    puVar2 = *(undefined4 **)(puVar2 + 2);
  } while (puVar2 != puVar1);
  std::ostream::_M_insert<bool>(true);
  return 0;
}

Assistant:

int main()
{
	int x = 10;
	ListNode *head = new ListNode(x);//,*head2(x),*head3(0);
	head->val = 1;
	head->next = head;
	cout << hasCycle(head);
	return 0;
}